

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O3

JsonObject * __thiscall Json::JsonDocument::object(JsonDocument *this)

{
  element_type *peVar1;
  int iVar2;
  JsonObject *pJVar3;
  
  peVar1 = (this->jsonValuePtr).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**peVar1->_vptr_JsonValue)();
    if ((iVar2 == 0) &&
       (peVar1 = (this->jsonValuePtr).
                 super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar1 != (element_type *)0x0)) {
      pJVar3 = (JsonObject *)__dynamic_cast(peVar1,&JsonValue::typeinfo,&JsonObject::typeinfo,0);
      return pJVar3;
    }
  }
  return (JsonObject *)0x0;
}

Assistant:

JsonObject *JsonDocument::object() {
        if (!isObject())return nullptr;
        return dynamic_cast<JsonObject *>(jsonValuePtr.get());
    }